

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.hpp
# Opt level: O3

size_t __thiscall webfront::fs::File::readData(File *this,span<char,_18446744073709551615UL> buffer)

{
  ulong uVar1;
  size_t sVar2;
  __extent_storage<18446744073709551615UL> _Var3;
  ulong uVar4;
  size_t sVar5;
  __extent_storage<18446744073709551615UL> _Var6;
  UIntByte chunk;
  
  _Var6 = buffer._M_extent._M_extent_value;
  chunk.uInt = 0;
  sVar2 = 0;
  _Var3._M_extent_value = sVar2;
  if (_Var6._M_extent_value != 0) {
    do {
      if (this->eofBit != false) {
        return sVar2;
      }
      uVar4 = this->readIndex & 7;
      if (uVar4 == 0) {
        uVar1 = *(ulong *)((long)(this->data)._M_ptr + this->readIndex);
        chunk.uInt = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 |
                     (uVar1 & 0xff0000000000) >> 0x18 | (uVar1 & 0xff00000000) >> 8 |
                     (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
                     (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
      }
      buffer._M_ptr[sVar2] = chunk.byte[uVar4];
      sVar5 = this->readIndex + 1;
      this->readIndex = sVar5;
      if (sVar5 == this->size) {
        this->eofBit = true;
      }
      sVar2 = sVar2 + 1;
      _Var3._M_extent_value = _Var6._M_extent_value;
    } while (_Var6._M_extent_value != sVar2);
  }
  return _Var3._M_extent_value;
}

Assistant:

size_t readData(std::span<char> buffer) {
        constexpr auto bytesPerInt = sizeof(decltype(data)::value_type);
        UIntByte chunk{};
        for (size_t index = 0; (index < buffer.size()); ++index) {
            if (eof()) return index;

            if (readIndex % bytesPerInt == 0) chunk = convert(data[readIndex / bytesPerInt]);

            buffer[index] = static_cast<char>(chunk.byte[readIndex % bytesPerInt]);
            readIndex++;
            if (readIndex == size) eofBit = true;
        }
        return buffer.size();
    }